

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exceptions.hpp
# Opt level: O2

Exception syntaxErrorAnalysis(vector<Token,_std::allocator<Token>_> *input)

{
  pointer pTVar1;
  TokenType TVar2;
  bool bVar3;
  ulong uVar4;
  undefined7 extraout_var;
  uint uVar5;
  ulong uVar6;
  _Elt_pointer pTVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  byte bVar11;
  byte bVar12;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_01;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_02;
  initializer_list<TokenType> __l_03;
  initializer_list<TokenType> __l_04;
  initializer_list<TokenType> __l_05;
  initializer_list<TokenType> __l_06;
  allocator<char> local_435;
  uint local_434;
  uint local_430;
  allocator<char> local_429;
  ulong local_428;
  allocator_type local_419;
  undefined4 local_418;
  allocator_type local_414;
  allocator_type local_413;
  allocator<char> local_412;
  allocator<char> local_411;
  ulong local_410;
  ulong local_408;
  Token token;
  Token prevToken;
  Token nextToken;
  Token tmp;
  string local_308 [32];
  string local_2e8 [32];
  string local_2c8 [32];
  string local_2a8 [40];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_280;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_268;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_250;
  stack<Token,_std::deque<Token,_std::allocator<Token>_>_> bracketStack;
  string local_1e8;
  undefined1 local_1c8 [40];
  _Vector_base<TokenType,_std::allocator<TokenType>_> local_1a0;
  _Vector_base<TokenType,_std::allocator<TokenType>_> local_188;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_170;
  vector<Token,_std::allocator<Token>_> local_158;
  vector<Token,_std::allocator<Token>_> local_140;
  undefined1 local_128 [40];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  string local_80;
  _Vector_base<TokenType,_std::allocator<TokenType>_> local_60;
  _Vector_base<TokenType,_std::allocator<TokenType>_> local_48;
  
  std::stack<Token,std::deque<Token,std::allocator<Token>>>::
  stack<std::deque<Token,std::allocator<Token>>,void>(&bracketStack);
  iVar8 = (int)(((long)(input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                       super__Vector_impl_data._M_finish -
                (long)(input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                      super__Vector_impl_data._M_start) / 0x28);
  uVar5 = iVar8 - 1;
  uVar4 = (ulong)(iVar8 + -2);
  uVar9 = 0;
  uVar6 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar6 = uVar9;
  }
  local_410 = 0;
  local_408 = 0;
  local_434 = 1;
  local_428 = uVar4;
  do {
    if (uVar9 == uVar6) {
      uVar5 = local_434;
      if (bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) {
        uVar5 = 0xffffffff;
      }
      uVar6 = 0x20;
      if (bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
          super__Deque_impl_data._M_start._M_cur) {
        uVar6 = 0x2b;
      }
      uVar4 = (ulong)uVar5;
LAB_0010a5b9:
      std::deque<Token,_std::allocator<Token>_>::~deque(&bracketStack.c);
      return (Exception)(uVar6 | uVar4 << 0x20);
    }
    iVar8 = (int)uVar9;
    local_434 = getLineIndex(input,iVar8);
    Token::Token(&token,(input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                        super__Vector_impl_data._M_start + uVar9);
    std::vector<Token,_std::allocator<Token>_>::vector(&local_140,input);
    prev(&prevToken,&local_140,iVar8);
    std::vector<Token,_std::allocator<Token>_>::~vector(&local_140);
    std::vector<Token,_std::allocator<Token>_>::vector(&local_158,input);
    next(&nextToken,&local_158,iVar8);
    std::vector<Token,_std::allocator<Token>_>::~vector(&local_158);
    if (token.type == EOL) {
      if (((local_408 & 1) != 0) || ((local_410 & 1) != 0)) {
LAB_00109b66:
        local_428 = (ulong)local_434;
        local_430 = 0x21;
        goto LAB_00109b71;
      }
LAB_00109de7:
      bVar11 = 0;
    }
    else {
      bVar3 = std::operator==(&token.source,"\"");
      if ((bVar3) && ((local_410 & 1) == 0)) {
        local_408 = local_408 ^ 1;
        goto LAB_00109de7;
      }
      bVar3 = std::operator==(&token.source,"\'");
      if ((bVar3) && ((local_408 & 1) == 0)) {
        local_410 = local_410 ^ 1;
        goto LAB_00109de7;
      }
      bVar3 = Token::isBracket(&token);
      if (bVar3) {
        bVar3 = Token::isLeftBracket(&token);
        if (bVar3) {
          std::deque<Token,_std::allocator<Token>_>::push_back(&bracketStack.c,&token);
          bVar11 = 0;
        }
        else {
          if (bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur) {
            local_428 = (ulong)local_434;
            local_430 = 0x20;
            goto LAB_00109b71;
          }
          pTVar7 = bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_cur;
          if (bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
              super__Deque_impl_data._M_finish._M_cur ==
              bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
              super__Deque_impl_data._M_finish._M_first) {
            pTVar7 = bracketStack.c.super__Deque_base<Token,_std::allocator<Token>_>._M_impl.
                     super__Deque_impl_data._M_finish._M_node[-1] + 0xc;
          }
          Token::Token(&tmp,pTVar7 + -1);
          std::deque<Token,_std::allocator<Token>_>::pop_back(&bracketStack.c);
          Token::Token((Token *)local_1c8,&tmp);
          Token::Token((Token *)local_128,&token);
          bVar3 = isBracketPair((Token *)local_1c8,(Token *)local_128);
          std::__cxx11::string::~string((string *)(local_128 + 8));
          std::__cxx11::string::~string((string *)(local_1c8 + 8));
          std::__cxx11::string::~string((string *)&tmp.source);
          local_428 = local_428 & 0xffffffff;
          if (!bVar3) {
            local_428 = (ulong)local_434;
            local_430 = 0x20;
          }
          bVar11 = bVar3 * '\x03' + 1;
        }
      }
      else {
        if (token.type == Name) {
          std::__cxx11::string::string((string *)&local_1e8,&token.source);
          bVar3 = isCorrectName(&local_1e8);
          if (bVar3) {
            std::__cxx11::string::~string((string *)&local_1e8);
          }
          else {
            std::__cxx11::string::string((string *)&local_80,&token.source);
            bVar3 = canBeDivided(&local_80);
            std::__cxx11::string::~string((string *)&local_80);
            std::__cxx11::string::~string((string *)&local_1e8);
            if (!bVar3) {
              if ((*token.source._M_dataplus._M_p == '\"') ||
                 (*token.source._M_dataplus._M_p == '\'')) goto LAB_00109b66;
              local_428 = (ulong)local_434;
              local_430 = 0x1f;
              goto LAB_00109b71;
            }
          }
LAB_00109da6:
          bVar3 = std::operator==(&token.source,".");
          if (bVar3) {
            bVar3 = std::operator==(&prevToken.source,".");
            if ((bVar3) || (bVar3 = std::operator==(&nextToken.source,"."), bVar3))
            goto LAB_00109de7;
            if ((prevToken.type == IntNumber) || (nextToken.type != IntNumber)) {
              bVar3 = std::operator==(&token.source,".");
              if (((uVar9 != 0) || (!bVar3)) &&
                 ((((prevToken.type != Keyword &&
                    (((bVar3 = Token::isOperator(&prevToken), !bVar3 && prevToken.type != Constant
                      && (nextToken.type != Keyword)) &&
                     (bVar3 = Token::isOperator(&nextToken), !bVar3 && nextToken.type != Constant)))
                    ) || (bVar3 = std::operator==(&prevToken.source,"this"), bVar3)) &&
                  ((bVar3 = Token::isRightBracket(&prevToken),
                   bVar3 || prevToken.type != Punctuation &&
                   (bVar3 = Token::isLeftBracket(&nextToken), bVar3 || nextToken.type != Punctuation
                   )))))) goto LAB_00109f2a;
              local_428 = (ulong)local_434;
              local_430 = 0x1b;
            }
            else {
              local_428 = (ulong)local_434;
              local_430 = 0x19;
            }
          }
          else {
LAB_00109f2a:
            if (((uVar9 < 2) || (token.type != IntNumber)) ||
               (((long)uVar4 <= (long)uVar9 ||
                ((((pTVar1 = (input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                             super__Vector_impl_data._M_start, pTVar1[uVar9 - 2].type != IntNumber
                   || (bVar3 = std::operator==(&pTVar1[uVar9 - 1].source,"."), !bVar3)) ||
                  (bVar3 = std::operator==(&(input->
                                            super__Vector_base<Token,_std::allocator<Token>_>).
                                            _M_impl.super__Vector_impl_data._M_start[uVar9 + 1].
                                            source,"."), !bVar3)) ||
                 ((input->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                  super__Vector_impl_data._M_start[uVar9 + 2].type != IntNumber)))))) {
              bVar3 = std::operator==(&token.source,",");
              if (bVar3) {
                if (((uVar9 != 0) &&
                    (bVar3 = Token::isRightBracket(&prevToken),
                    bVar3 || prevToken.type != Punctuation)) &&
                   (bVar3 = Token::isLeftBracket(&nextToken), bVar3 || nextToken.type != Punctuation
                   )) {
                  std::__cxx11::string::string<std::allocator<char>>((string *)&tmp,"+",&local_435);
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)(tmp.source.field_2._M_local_buf + 8),"-",&local_429);
                  __l._M_len = 2;
                  __l._M_array = (iterator)&tmp;
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::vector(&local_250,__l,&local_419);
                  std::__cxx11::string::string((string *)&local_a0,&prevToken.source);
                  bVar3 = contain<std::__cxx11::string>(&local_250,&local_a0);
                  if (bVar3) {
                    local_418 = 0;
                  }
                  else {
                    bVar3 = Token::isOperator(&prevToken);
                    local_418 = (undefined4)CONCAT71(extraout_var,bVar3);
                  }
                  std::__cxx11::string::~string((string *)&local_a0);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::~vector(&local_250);
                  lVar10 = 0x20;
                  do {
                    std::__cxx11::string::~string((string *)((long)&tmp.type + lVar10));
                    lVar10 = lVar10 + -0x20;
                  } while (lVar10 != -0x20);
                  if ((byte)local_418 == '\0') {
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&tmp,"+",&local_435);
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)(tmp.source.field_2._M_local_buf + 8),"-",&local_429);
                    std::__cxx11::string::string<std::allocator<char>>
                              (local_308,"!",(allocator<char> *)&local_419);
                    __l_00._M_len = 3;
                    __l_00._M_array = (iterator)&tmp;
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::vector(&local_268,__l_00,&local_414);
                    std::__cxx11::string::string((string *)&local_c0,&nextToken.source);
                    bVar3 = contain<std::__cxx11::string>(&local_268,&local_c0);
                    if (bVar3) {
                      bVar3 = false;
                    }
                    else {
                      bVar3 = Token::isOperator(&nextToken);
                    }
                    std::__cxx11::string::~string((string *)&local_c0);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::~vector(&local_268);
                    lVar10 = 0x40;
                    do {
                      std::__cxx11::string::~string((string *)((long)&tmp.type + lVar10));
                      lVar10 = lVar10 + -0x20;
                    } while (lVar10 != -0x20);
                    if (bVar3 == false) {
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&tmp,"this",&local_435);
                      __l_01._M_len = 1;
                      __l_01._M_array = (iterator)&tmp;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::vector(&local_280,__l_01,(allocator_type *)&local_429);
                      std::__cxx11::string::string((string *)&local_e0,&prevToken.source);
                      bVar3 = contain<std::__cxx11::string>(&local_280,&local_e0);
                      local_418 = CONCAT31(local_418._1_3_,prevToken.type != Keyword);
                      std::__cxx11::string::~string((string *)&local_e0);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::~vector(&local_280);
                      std::__cxx11::string::~string((string *)&tmp);
                      if (bVar3 || (byte)local_418 != '\0') {
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&tmp,"this",&local_435);
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)(tmp.source.field_2._M_local_buf + 8),"not",&local_429)
                        ;
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_308,"lambda",(allocator<char> *)&local_419);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_2e8,"new",(allocator<char> *)&local_414);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_2c8,"ref",&local_411);
                        std::__cxx11::string::string<std::allocator<char>>
                                  (local_2a8,"out",&local_412);
                        __l_02._M_len = 6;
                        __l_02._M_array = (iterator)&tmp;
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::vector(&local_170,__l_02,&local_413);
                        std::__cxx11::string::string((string *)&local_100,&nextToken.source);
                        bVar3 = contain<std::__cxx11::string>(&local_170,&local_100);
                        TVar2 = nextToken.type;
                        local_418 = CONCAT31(local_418._1_3_,bVar3);
                        std::__cxx11::string::~string((string *)&local_100);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::~vector(&local_170);
                        lVar10 = 0xa0;
                        do {
                          std::__cxx11::string::~string((string *)((long)&tmp.type + lVar10));
                          lVar10 = lVar10 + -0x20;
                        } while (lVar10 != -0x20);
                        bVar11 = (byte)local_418 | TVar2 != Keyword;
                        local_418 = CONCAT31(local_418._1_3_,bVar11);
                        if (bVar11 != 0) goto LAB_0010a36d;
                      }
                    }
                  }
                }
                local_428 = (ulong)local_434;
                local_430 = 0x2a;
              }
              else {
LAB_0010a36d:
                if (token.type == Name) {
                  if (uVar9 == 0) {
LAB_0010a3fc:
                    tmp.type = Name;
                    tmp._4_4_ = 7;
                    tmp.source._M_dataplus._M_p = (pointer)0x90000000a;
                    tmp.source._M_string_length._0_4_ = 5;
                    __l_04._M_len = 5;
                    __l_04._M_array = &tmp.type;
                    std::vector<TokenType,_std::allocator<TokenType>_>::vector
                              ((vector<TokenType,_std::allocator<TokenType>_> *)&local_188,__l_04,
                               (allocator_type *)&local_435);
                    bVar3 = contain<TokenType>((vector<TokenType,_std::allocator<TokenType>_> *)
                                               &local_188,
                                               (input->
                                               super__Vector_base<Token,_std::allocator<Token>_>).
                                               _M_impl.super__Vector_impl_data._M_start[uVar9 + 1].
                                               type);
                    std::_Vector_base<TokenType,_std::allocator<TokenType>_>::~_Vector_base
                              (&local_188);
                    if (!bVar3) goto LAB_0010a455;
                  }
                  else {
                    tmp.type = Name;
                    tmp._4_4_ = 7;
                    tmp.source._M_dataplus._M_p = (pointer)0x90000000a;
                    tmp.source._M_string_length._0_4_ = 5;
                    __l_03._M_len = 5;
                    __l_03._M_array = &tmp.type;
                    std::vector<TokenType,_std::allocator<TokenType>_>::vector
                              ((vector<TokenType,_std::allocator<TokenType>_> *)&local_48,__l_03,
                               (allocator_type *)&local_435);
                    bVar3 = contain<TokenType>((vector<TokenType,_std::allocator<TokenType>_> *)
                                               &local_48,
                                               (input->
                                               super__Vector_base<Token,_std::allocator<Token>_>).
                                               _M_impl.super__Vector_impl_data._M_start[uVar9 - 1].
                                               type);
                    std::_Vector_base<TokenType,_std::allocator<TokenType>_>::~_Vector_base
                              (&local_48);
                    if (!bVar3) goto LAB_0010a3fc;
                  }
                }
                else {
LAB_0010a455:
                  if (token.type == IntNumber) {
                    if (uVar9 != 0) {
                      tmp.type = IntNumber;
                      tmp._4_4_ = 10;
                      tmp.source._M_dataplus._M_p = (pointer)0x500000009;
                      __l_05._M_len = 4;
                      __l_05._M_array = &tmp.type;
                      std::vector<TokenType,_std::allocator<TokenType>_>::vector
                                ((vector<TokenType,_std::allocator<TokenType>_> *)&local_60,__l_05,
                                 (allocator_type *)&local_435);
                      bVar3 = contain<TokenType>((vector<TokenType,_std::allocator<TokenType>_> *)
                                                 &local_60,
                                                 (input->
                                                 super__Vector_base<Token,_std::allocator<Token>_>).
                                                 _M_impl.super__Vector_impl_data._M_start[uVar9 - 1]
                                                 .type);
                      local_418 = CONCAT31(local_418._1_3_,bVar3);
                      std::_Vector_base<TokenType,_std::allocator<TokenType>_>::~_Vector_base
                                (&local_60);
                      if ((byte)local_418 != '\0') goto LAB_0010a569;
                    }
                    tmp.type = IntNumber;
                    tmp._4_4_ = 10;
                    tmp.source._M_dataplus._M_p = (pointer)0x500000009;
                    __l_06._M_len = 4;
                    __l_06._M_array = &tmp.type;
                    std::vector<TokenType,_std::allocator<TokenType>_>::vector
                              ((vector<TokenType,_std::allocator<TokenType>_> *)&local_1a0,__l_06,
                               (allocator_type *)&local_435);
                    bVar3 = contain<TokenType>((vector<TokenType,_std::allocator<TokenType>_> *)
                                               &local_1a0,
                                               (input->
                                               super__Vector_base<Token,_std::allocator<Token>_>).
                                               _M_impl.super__Vector_impl_data._M_start[uVar9 + 1].
                                               type);
                    std::_Vector_base<TokenType,_std::allocator<TokenType>_>::~_Vector_base
                              (&local_1a0);
                    if (bVar3) goto LAB_0010a569;
                  }
                  bVar3 = std::operator==(&token.source,":");
                  bVar12 = 0;
                  bVar11 = 0;
                  if ((!bVar3) ||
                     ((uVar9 != 0 &&
                      (((bVar11 = bVar12, prevToken.type == Name && (nextToken.type == Name)) ||
                       ((bVar3 = std::operator==(&prevToken.source,")"), bVar3 ||
                        (bVar3 = std::operator==(&nextToken.source,"="), bVar3))))))))
                  goto LAB_00109deb;
                }
LAB_0010a569:
                local_428 = (ulong)local_434;
                local_430 = 0x1a;
              }
            }
            else {
              local_428 = (ulong)local_434;
              local_430 = 0x18;
            }
          }
        }
        else {
          if ((token.type != CharLiteral) || (token.source._M_string_length == 3))
          goto LAB_00109da6;
          local_428 = (ulong)local_434;
          local_430 = 0x1c;
        }
LAB_00109b71:
        bVar11 = 1;
      }
    }
LAB_00109deb:
    std::__cxx11::string::~string((string *)&nextToken.source);
    std::__cxx11::string::~string((string *)&prevToken.source);
    std::__cxx11::string::~string((string *)&token.source);
    if ((bVar11 & 3) != 0) {
      uVar6 = (ulong)local_430;
      uVar4 = local_428;
      goto LAB_0010a5b9;
    }
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

Exception syntaxErrorAnalysis(vector<Token> input) {
	int lineIndex = 1;
	stack<Token> bracketStack;
	bool isString = false, isChar = false;
	// длина входного потока
	int end = input.size();
	// последний символ - EOfF, поэтому читаем до предпоследнего
	for (int i = 0; i < end - 1; ++i) {
		lineIndex = getLineIndex(input, i);
		Token token = input[i];
		Token prevToken = prev(input, i), nextToken = next(input, i);

		if (token.isEndOfLine()) {
			if (isString or isChar) {
				return Exception(QuotesSequenceError, lineIndex);
			}
			continue;
		}
		// обработка строк
		if (token.source == "\"" and not isChar) {
			isString = not isString;
			continue;
		}
		if (token.source == "\'" and not isString) {
			isChar = not isChar;
			continue;
		}
		// обработка скобочных последовательностей
		if (token.isBracket()) {
			if (token.isLeftBracket()) {
				bracketStack.push(token);
			} else {
				if (bracketStack.empty()) {
					return Exception(BracketSequenceError, lineIndex);
				} else {
					Token tmp = bracketStack.top();
					bracketStack.pop();
					if (not isBracketPair(tmp, token))
						return Exception(BracketSequenceError, lineIndex);
				}
			}
			continue;
		}
		// обработка CharFormatError
		if (token.type == CharLiteral and token.source.size() != 3) {
			return Exception(CharFormatError, lineIndex);
		}
		// обработка неправильных имен
		if (token.type == Name and not isCorrectName(token.source) and not canBeDivided(token.source)) {
			if (token.source[0] == '\"' or token.source[0] == '\'') {
				return Exception(QuotesSequenceError, lineIndex);
			}
			return Exception(NameError, lineIndex);
		}
		// MemberError для Int после Name
		// а также UnexpectedDotError - один из операндов точки ключевое слово или оператор и тд
		if (token.source == ".") {
			if (prevToken.source == "." or nextToken.source == ".") continue;
			if (prevToken.type != IntNumber and nextToken.type == IntNumber) {
				return Exception(MemberError, lineIndex);
			}
			if (token.source == "." and i == 0) {
				return Exception(UnexpectedDotError, lineIndex);
			}
			if (prevToken.type == Keyword or prevToken.isOperator() or prevToken.type == Constant or
			    nextToken.type == Keyword or nextToken.isOperator() or nextToken.type == Constant) {
				if (prevToken.source != "this")
					return Exception(UnexpectedDotError, lineIndex);
			}
			if (not prevToken.isRightBracket() and prevToken.type == Punctuation) {
				return Exception(UnexpectedDotError, lineIndex);
			}
			if (not nextToken.isLeftBracket() and nextToken.type == Punctuation) {
				return Exception(UnexpectedDotError, lineIndex);
			}
		}
		// обработка неправильного использования оператора .  - TooManyPointsInNumber
		if (token.type == IntNumber and i > 1 and i < end - 2) {
			if (input[i - 2].type == IntNumber and input[i - 1].source == "." and
			    input[i + 1].source == "." and input[i + 2].type == IntNumber) {
				return Exception(TooManyPointsInNumber, lineIndex);
			}
		}
		// обработка UnexpectedTokenError
		if (token.source == ",") {
			if (i == 0) return Exception(UnexpectedTokenError, lineIndex);

			if (not prevToken.isRightBracket() and prevToken.type == Punctuation) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not nextToken.isLeftBracket() and nextToken.type == Punctuation) {
				return Exception(UnexpectedTokenError, lineIndex);
			}

			if (not contain({"+", "-"}, prevToken.source) and prevToken.isOperator()) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not contain({"+", "-", "!"}, nextToken.source) and nextToken.isOperator()) {
				return Exception(UnexpectedTokenError, lineIndex);
			}

			if (not contain({"this"}, prevToken.source) and prevToken.type == Keyword) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
			if (not contain({"this", "not", "lambda", "new", "ref", "out"}, nextToken.source) and
			    nextToken.type == Keyword) {
				return Exception(UnexpectedTokenError, lineIndex);
			}
		}

		// SyntaxError
		if (token.type == Name) {
			if (i != 0) {
				if (contain({Name, IntNumber, CharLiteral, StringLiteral, Constant}, input[i - 1].type))
					return Exception(SyntaxError, lineIndex);
			}
			if (contain({Name, IntNumber, CharLiteral, StringLiteral, Constant}, input[i + 1].type)) {
				return Exception(SyntaxError, lineIndex);
			}
		}

		// TODO: возможны ошибки с Keyword
		if (token.type == IntNumber) {
			if (i != 0) {
				if (contain({IntNumber, CharLiteral, StringLiteral, Constant}, input[i - 1].type)) {
					return Exception(SyntaxError, lineIndex);
				}
//				if (input[i - 1].type == Keyword and input[i - 1].source != "else") {
//					return Exception(SyntaxError, lineIndex);
//				}
			}
			if (contain({IntNumber, CharLiteral, StringLiteral, Constant}, input[i + 1].type)) {
				return Exception(SyntaxError, lineIndex);
			}
		}

		if (token.source == ":") {
			if (i == 0) return Exception(SyntaxError, lineIndex);
			if ((prevToken.type != Name or nextToken.type != Name) and prevToken.source != ")" and
			    nextToken.source != "=") {
				return Exception(SyntaxError, lineIndex);
			}
		}
	}
	if (not bracketStack.empty()) return Exception(BracketSequenceError, lineIndex);
	return Exception(Nothing);
}